

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.cpp
# Opt level: O1

unique_ptr<duckdb::IndexScanState,_std::default_delete<duckdb::IndexScanState>,_true> __thiscall
duckdb::ART::TryInitializeScan(ART *this,Expression *expr,Expression *filter_expr)

{
  _Head_base<0UL,_duckdb::ARTIndexScanState_*,_false> _Var1;
  bool bVar2;
  ExpressionType EVar3;
  ExpressionType expression_type;
  int iVar4;
  tuple<duckdb::ExpressionTypeMatcher_*,_std::default_delete<duckdb::ExpressionTypeMatcher>_> tVar5;
  reference pvVar6;
  BoundComparisonExpression *pBVar7;
  BoundConstantExpression *pBVar8;
  pointer pEVar9;
  undefined7 extraout_var;
  BoundBetweenExpression *pBVar10;
  ARTIndexScanState *__s;
  pointer pAVar11;
  Expression *in_RCX;
  ulong uVar12;
  Value *pVVar13;
  undefined4 uVar14;
  long lVar15;
  Value constant_value;
  ComparisonExpressionMatcher matcher;
  vector<std::reference_wrapper<duckdb::Expression>,_true> bindings;
  Value high_value;
  Value low_value;
  Value equal_value;
  _Head_base<0UL,_duckdb::ARTIndexScanState_*,_false> local_1f0;
  ARTIndexScanState *local_1e8;
  undefined4 local_1dc;
  Value local_1d8;
  undefined1 local_198 [32];
  pointer local_178;
  pointer puStack_170;
  pointer local_168;
  Policy local_160;
  vector<std::reference_wrapper<duckdb::Expression>,_true> local_158;
  LogicalType local_138;
  LogicalType local_120;
  Value local_108;
  Value local_c8;
  LogicalType local_88;
  Value local_70;
  
  LogicalType::LogicalType(&local_88,SQLNULL);
  Value::Value(&local_c8,&local_88);
  LogicalType::~LogicalType(&local_88);
  LogicalType::LogicalType(&local_120,SQLNULL);
  Value::Value(&local_108,&local_120);
  LogicalType::~LogicalType(&local_120);
  LogicalType::LogicalType(&local_138,SQLNULL);
  pVVar13 = &local_70;
  Value::Value(pVVar13,&local_138);
  LogicalType::~LogicalType(&local_138);
  local_198[8] = BOUND_COMPARISON;
  local_198._16_8_ = (_Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false>)0x0;
  local_198._24_8_ =
       (__uniq_ptr_data<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>,_true,_true>)
       0x0;
  local_198._0_8_ = &PTR__ComparisonExpressionMatcher_024b4378;
  local_178 = (pointer)0x0;
  puStack_170 = (pointer)0x0;
  local_168 = (pointer)0x0;
  local_160 = INVALID;
  tVar5.
  super__Tuple_impl<0UL,_duckdb::ExpressionTypeMatcher_*,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_duckdb::ExpressionTypeMatcher_*,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
        )operator_new(8);
  *(undefined ***)
   tVar5.
   super__Tuple_impl<0UL,_duckdb::ExpressionTypeMatcher_*,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
   .super__Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false>._M_head_impl =
       &PTR__ExpressionTypeMatcher_024b23f0;
  if ((__uniq_ptr_impl<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
       )local_198._16_8_ !=
      (__uniq_ptr_impl<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
       )0x0) {
    lVar15 = *(long *)local_198._16_8_;
    local_198._16_8_ =
         tVar5.
         super__Tuple_impl<0UL,_duckdb::ExpressionTypeMatcher_*,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
         .super__Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false>._M_head_impl;
    (**(code **)(lVar15 + 8))();
    tVar5.
    super__Tuple_impl<0UL,_duckdb::ExpressionTypeMatcher_*,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
    .super__Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_duckdb::ExpressionTypeMatcher_*,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
          )(_Tuple_impl<0UL,_duckdb::ExpressionTypeMatcher_*,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
            )local_198._16_8_;
  }
  local_198._16_8_ =
       tVar5.
       super__Tuple_impl<0UL,_duckdb::ExpressionTypeMatcher_*,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
       .super__Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false>._M_head_impl;
  local_1d8.type_._0_8_ = operator_new(0x28);
  ((ExpressionMatcher *)local_1d8.type_._0_8_)->expr_class = INVALID;
  (((ExpressionMatcher *)local_1d8.type_._0_8_)->expr_type).
  super_unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
       = (unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
          )0x0;
  (((ExpressionMatcher *)local_1d8.type_._0_8_)->type).
  super_unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_> =
       (unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>)0x0;
  ((ExpressionMatcher *)local_1d8.type_._0_8_)->_vptr_ExpressionMatcher =
       (_func_int **)&PTR__ExpressionMatcher_024b42f8;
  ((ExpressionMatcher *)(local_1d8.type_._0_8_ + 0x20))->_vptr_ExpressionMatcher =
       (_func_int **)filter_expr;
  ::std::
  vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
              *)&local_178,
             (unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
              *)&local_1d8);
  if ((ExpressionMatcher *)local_1d8.type_._0_8_ != (ExpressionMatcher *)0x0) {
    (**(code **)(*(long *)local_1d8.type_._0_8_ + 8))();
  }
  local_1d8.type_._0_8_ = operator_new(0x20);
  *(undefined1 *)(local_1d8.type_._0_8_ + 8) = 0x1f;
  *(long *)(local_1d8.type_._0_8_ + 0x10) = 0;
  *(long *)(local_1d8.type_._0_8_ + 0x18) = 0;
  *(undefined ***)local_1d8.type_._0_8_ = &PTR__ExpressionMatcher_02493c38;
  ::std::
  vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
              *)&local_178,
             (unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
              *)&local_1d8);
  if ((_Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
       )local_1d8.type_._0_8_ != (ExpressionMatcher *)0x0) {
    (**(code **)(*(long *)local_1d8.type_._0_8_ + 8))();
  }
  local_160 = UNORDERED;
  local_158.
  super_vector<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.
  super_vector<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.
  super_vector<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar2 = ComparisonExpressionMatcher::Match
                    ((ComparisonExpressionMatcher *)local_198,in_RCX,&local_158);
  if (bVar2) {
    pvVar6 = vector<std::reference_wrapper<duckdb::Expression>,_true>::operator[](&local_158,0);
    pBVar7 = BaseExpression::Cast<duckdb::BoundComparisonExpression>
                       (&pvVar6->_M_data->super_BaseExpression);
    pvVar6 = vector<std::reference_wrapper<duckdb::Expression>,_true>::operator[](&local_158,2);
    pBVar8 = BaseExpression::Cast<duckdb::BoundConstantExpression>
                       (&pvVar6->_M_data->super_BaseExpression);
    Value::Value(&local_1d8,&pBVar8->value);
    EVar3 = (pBVar7->super_Expression).super_BaseExpression.type;
    uVar12 = CONCAT71((int7)((ulong)filter_expr >> 8),EVar3);
    pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(&pBVar7->left);
    if ((pEVar9->super_BaseExpression).type == VALUE_CONSTANT) {
      EVar3 = FlipComparisonExpression(EVar3);
      uVar12 = CONCAT71(extraout_var,EVar3) & 0xffffffff;
    }
    if ((byte)uVar12 == 0x19) {
      Value::operator=(&local_70,&local_1d8);
      uVar14 = 0;
LAB_01716831:
      uVar12 = 0;
    }
    else {
      if (((byte)uVar12 & 0xfd) != 0x1c) {
        Value::operator=(&local_108,&local_1d8);
        uVar14 = (undefined4)uVar12;
        goto LAB_01716831;
      }
      Value::operator=(&local_c8,&local_1d8);
      uVar14 = 0;
    }
    EVar3 = (ExpressionType)uVar12;
    Value::~Value(&local_1d8);
  }
  else if ((in_RCX->super_BaseExpression).type == COMPARE_BETWEEN) {
    pBVar10 = BaseExpression::Cast<duckdb::BoundBetweenExpression>(&in_RCX->super_BaseExpression);
    pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(&pBVar10->input);
    iVar4 = (*(pEVar9->super_BaseExpression)._vptr_BaseExpression[10])(pEVar9);
    if ((char)iVar4 == '\0') {
LAB_01716804:
      (this->super_BoundIndex).super_Index._vptr_Index = (_func_int **)0x0;
      uVar14 = 0;
      EVar3 = INVALID;
      bVar2 = false;
    }
    else {
      pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(&pBVar10->lower);
      if ((pEVar9->super_BaseExpression).type != VALUE_CONSTANT) goto LAB_01716804;
      pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(&pBVar10->upper);
      if ((pEVar9->super_BaseExpression).type != VALUE_CONSTANT) goto LAB_01716804;
      pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(&pBVar10->lower);
      pBVar8 = BaseExpression::Cast<duckdb::BoundConstantExpression>(&pEVar9->super_BaseExpression);
      Value::operator=(&local_c8,&pBVar8->value);
      bVar2 = pBVar10->lower_inclusive;
      pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(&pBVar10->upper);
      pBVar8 = BaseExpression::Cast<duckdb::BoundConstantExpression>(&pEVar9->super_BaseExpression);
      Value::operator=(&local_108,&pBVar8->value);
      EVar3 = bVar2 * '\x02' | COMPARE_GREATERTHAN;
      uVar14 = (undefined4)
               CONCAT71((int7)((ulong)pBVar10 >> 8),pBVar10->upper_inclusive * '\x02' + '\x1b');
      bVar2 = true;
    }
    if (!bVar2) goto LAB_01716899;
  }
  else {
    uVar14 = 0;
    EVar3 = INVALID;
  }
  expression_type = COMPARE_BOUNDARY_START;
  if (local_70.is_null == true) {
    if ((local_c8.is_null == true) && (local_108.is_null == true)) {
      (this->super_BoundIndex).super_Index._vptr_Index = (_func_int **)0x0;
      goto LAB_01716899;
    }
    if (local_c8.is_null == false) {
      if (local_108.is_null == false) {
        __s = (ARTIndexScanState *)operator_new(0xa8);
        lVar15 = 0;
        local_1dc = uVar14;
        switchD_0105dc25::default(__s,0,0xa8);
        (__s->super_IndexScanState)._vptr_IndexScanState =
             (_func_int **)&PTR__ARTIndexScanState_024b2358;
        pVVar13 = __s->values;
        local_1e8 = __s;
        do {
          LogicalType::LogicalType(&local_1d8.type_,SQLNULL);
          Value::Value(pVVar13,&local_1d8.type_);
          LogicalType::~LogicalType(&local_1d8.type_);
          lVar15 = lVar15 + -0x40;
          pVVar13 = pVVar13 + 1;
        } while (lVar15 != -0x80);
        local_1e8->checked = false;
        (local_1e8->row_ids).super_vector<long,_std::allocator<long>_>.
        super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
             (pointer)0x0;
        (local_1e8->row_ids).super_vector<long,_std::allocator<long>_>.
        super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
             (pointer)0x0;
        (local_1e8->row_ids).super_vector<long,_std::allocator<long>_>.
        super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        local_1f0._M_head_impl = local_1e8;
        pAVar11 = unique_ptr<duckdb::ARTIndexScanState,_std::default_delete<duckdb::ARTIndexScanState>,_true>
                  ::operator->((unique_ptr<duckdb::ARTIndexScanState,_std::default_delete<duckdb::ARTIndexScanState>,_true>
                                *)&local_1f0);
        Value::operator=(pAVar11->values,&local_c8);
        pAVar11 = unique_ptr<duckdb::ARTIndexScanState,_std::default_delete<duckdb::ARTIndexScanState>,_true>
                  ::operator->((unique_ptr<duckdb::ARTIndexScanState,_std::default_delete<duckdb::ARTIndexScanState>,_true>
                                *)&local_1f0);
        pAVar11->expressions[0] = EVar3;
        pAVar11 = unique_ptr<duckdb::ARTIndexScanState,_std::default_delete<duckdb::ARTIndexScanState>,_true>
                  ::operator->((unique_ptr<duckdb::ARTIndexScanState,_std::default_delete<duckdb::ARTIndexScanState>,_true>
                                *)&local_1f0);
        Value::operator=(pAVar11->values + 1,&local_108);
        pAVar11 = unique_ptr<duckdb::ARTIndexScanState,_std::default_delete<duckdb::ARTIndexScanState>,_true>
                  ::operator->((unique_ptr<duckdb::ARTIndexScanState,_std::default_delete<duckdb::ARTIndexScanState>,_true>
                                *)&local_1f0);
        _Var1._M_head_impl = local_1f0._M_head_impl;
        pAVar11->expressions[1] = (ExpressionType)local_1dc;
        local_1f0._M_head_impl = (ARTIndexScanState *)0x0;
        (this->super_BoundIndex).super_Index._vptr_Index = (_func_int **)_Var1._M_head_impl;
        goto LAB_01716899;
      }
      pVVar13 = &local_c8;
      expression_type = EVar3;
    }
    else {
      pVVar13 = &local_108;
      expression_type = (ExpressionType)uVar14;
    }
  }
  InitializeScanSinglePredicate((duckdb *)this,pVVar13,expression_type);
LAB_01716899:
  if (local_158.
      super_vector<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_158.
                    super_vector<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
                    .
                    super__Vector_base<std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  local_198._0_8_ = &PTR__ComparisonExpressionMatcher_024b4378;
  ::std::
  vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>_>_>
             *)&local_178);
  local_198._0_8_ = &PTR__ExpressionMatcher_024b42c0;
  if ((TypeMatcher *)local_198._24_8_ != (TypeMatcher *)0x0) {
    (*(*(_func_int ***)local_198._24_8_)[1])();
  }
  local_198._24_8_ =
       (_Tuple_impl<0UL,_duckdb::TypeMatcher_*,_std::default_delete<duckdb::TypeMatcher>_>)0x0;
  if ((ExpressionTypeMatcher *)local_198._16_8_ != (ExpressionTypeMatcher *)0x0) {
    (*(*(_func_int ***)local_198._16_8_)[1])();
  }
  Value::~Value(&local_70);
  Value::~Value(&local_108);
  Value::~Value(&local_c8);
  return (unique_ptr<duckdb::IndexScanState,_std::default_delete<duckdb::IndexScanState>_>)
         (unique_ptr<duckdb::IndexScanState,_std::default_delete<duckdb::IndexScanState>_>)this;
}

Assistant:

unique_ptr<IndexScanState> ART::TryInitializeScan(const Expression &expr, const Expression &filter_expr) {
	Value low_value, high_value, equal_value;
	ExpressionType low_comparison_type = ExpressionType::INVALID, high_comparison_type = ExpressionType::INVALID;

	// Try to find a matching index for any of the filter expressions.
	ComparisonExpressionMatcher matcher;

	// Match on a comparison type.
	matcher.expr_type = make_uniq<ComparisonExpressionTypeMatcher>();

	// Match on a constant comparison with the indexed expression.
	matcher.matchers.push_back(make_uniq<ExpressionEqualityMatcher>(expr));
	matcher.matchers.push_back(make_uniq<ConstantExpressionMatcher>());
	matcher.policy = SetMatcher::Policy::UNORDERED;

	vector<reference<Expression>> bindings;
	auto filter_match =
	    matcher.Match(const_cast<Expression &>(filter_expr), bindings); // NOLINT: Match does not alter the expr.
	if (filter_match) {
		// This is a range or equality comparison with a constant value, so we can use the index.
		// 		bindings[0] = the expression
		// 		bindings[1] = the index expression
		// 		bindings[2] = the constant
		auto &comparison = bindings[0].get().Cast<BoundComparisonExpression>();
		auto constant_value = bindings[2].get().Cast<BoundConstantExpression>().value;
		auto comparison_type = comparison.GetExpressionType();

		if (comparison.left->GetExpressionType() == ExpressionType::VALUE_CONSTANT) {
			// The expression is on the right side, we flip the comparison expression.
			comparison_type = FlipComparisonExpression(comparison_type);
		}

		if (comparison_type == ExpressionType::COMPARE_EQUAL) {
			// An equality value overrides any other bounds.
			equal_value = constant_value;
		} else if (comparison_type == ExpressionType::COMPARE_GREATERTHANOREQUALTO ||
		           comparison_type == ExpressionType::COMPARE_GREATERTHAN) {
			// This is a lower bound.
			low_value = constant_value;
			low_comparison_type = comparison_type;
		} else {
			// This is an upper bound.
			high_value = constant_value;
			high_comparison_type = comparison_type;
		}

	} else if (filter_expr.GetExpressionType() == ExpressionType::COMPARE_BETWEEN) {
		auto &between = filter_expr.Cast<BoundBetweenExpression>();
		if (!between.input->Equals(expr)) {
			// The expression does not match the index expression.
			return nullptr;
		}

		if (between.lower->GetExpressionType() != ExpressionType::VALUE_CONSTANT ||
		    between.upper->GetExpressionType() != ExpressionType::VALUE_CONSTANT) {
			// Not a constant expression.
			return nullptr;
		}

		low_value = between.lower->Cast<BoundConstantExpression>().value;
		low_comparison_type = between.lower_inclusive ? ExpressionType::COMPARE_GREATERTHANOREQUALTO
		                                              : ExpressionType::COMPARE_GREATERTHAN;
		high_value = (between.upper->Cast<BoundConstantExpression>()).value;
		high_comparison_type =
		    between.upper_inclusive ? ExpressionType::COMPARE_LESSTHANOREQUALTO : ExpressionType::COMPARE_LESSTHAN;
	}

	// We cannot use an index scan.
	if (equal_value.IsNull() && low_value.IsNull() && high_value.IsNull()) {
		return nullptr;
	}

	// Initialize the index scan state and return it.
	if (!equal_value.IsNull()) {
		// Equality predicate.
		return InitializeScanSinglePredicate(equal_value, ExpressionType::COMPARE_EQUAL);
	}
	if (!low_value.IsNull() && !high_value.IsNull()) {
		// Two-sided predicate.
		return InitializeScanTwoPredicates(low_value, low_comparison_type, high_value, high_comparison_type);
	}
	if (!low_value.IsNull()) {
		// Less-than predicate.
		return InitializeScanSinglePredicate(low_value, low_comparison_type);
	}
	// Greater-than predicate.
	return InitializeScanSinglePredicate(high_value, high_comparison_type);
}